

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void messageOut(TidyMessageImpl *message)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  TidyReportLevel TVar4;
  TidyDocImpl *pTVar5;
  StreamOut *pSVar6;
  Bool BVar7;
  Bool BVar8;
  byte *pbVar9;
  bool bVar10;
  
  if (message == (TidyMessageImpl *)0x0) {
    return;
  }
  pTVar5 = message->tidyDoc;
  BVar8 = message->allowMessage;
  TVar4 = message->level;
  uVar1 = TVar4 - TidyInfo;
  switch(uVar1) {
  case 0:
    pTVar5->infoMessages = pTVar5->infoMessages + 1;
    break;
  case 1:
    pTVar5->warnings = pTVar5->warnings + 1;
    break;
  case 2:
    pTVar5->optionErrors = pTVar5->optionErrors + 1;
    break;
  case 3:
    pTVar5->accessErrors = pTVar5->accessErrors + 1;
    break;
  case 4:
    pTVar5->errors = pTVar5->errors + 1;
    break;
  case 5:
    pTVar5->docErrors = pTVar5->docErrors + 1;
  }
  BVar8 = message->muted == no & BVar8;
  if ((TVar4 < TidyDialogueSummary) && ((pTVar5->config).value[0x49].v <= (ulong)pTVar5->errors)) {
    BVar8 = no;
  }
  if ((*(int *)((pTVar5->config).value + 0x44) == 1) &&
     (BVar7 = no, bVar10 = BVar8 != no, BVar8 = BVar7, bVar10)) {
    uVar2 = message->code - 0x276;
    if (((5 < uVar2) || ((0x25U >> (uVar2 & 0x1f) & 1) == 0)) &&
       ((8 < uVar1 || ((0x105U >> (uVar1 & 0x1f) & 1) == 0)))) {
      if (TVar4 < TidyDialogueSummary) {
        BVar8 = yes;
      }
      else {
        BVar8 = (Bool)(message->code == 0x21c);
      }
    }
  }
  BVar7 = BVar8;
  if (*(int *)((pTVar5->config).value + 0x4b) == 0) {
    BVar7 = no;
    if ((TVar4 != TidyInfo) && (BVar7 = no, BVar8 != no)) {
      BVar7 = (uint)(TVar4 != TidyDialogueInfo);
    }
  }
  if (*(int *)((pTVar5->config).value + 0x4e) == 0) {
    if (BVar7 == no) goto LAB_0014b2ac;
    BVar7 = (Bool)(TVar4 != TidyWarning);
  }
  if (BVar7 != no) {
    pSVar6 = pTVar5->errout;
    pbVar9 = (byte *)message->messageOutput;
    do {
      bVar3 = *pbVar9;
      if (bVar3 == '\n') {
        prvTidyWriteChar(10,pTVar5->errout);
      }
      else {
        if (bVar3 == '\0') goto LAB_0014b29d;
        (*(pSVar6->sink).putByte)((pSVar6->sink).sinkData,bVar3);
      }
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
LAB_0014b2ac:
  prvTidytidyMessageRelease(message);
  return;
LAB_0014b29d:
  prvTidyWriteChar(10,pTVar5->errout);
  goto LAB_0014b2ac;
}

Assistant:

static void messageOut( TidyMessageImpl *message )
{
    TidyDocImpl *doc;
    Bool go = yes;

    if ( !message )
        return;

    doc = message->tidyDoc;

    /* The filter has had a chance to suppress *any* message from output. */
    go = message->allowMessage;

    /* Update the count of each report type. */
    switch ( message->level )
    {
        case TidyInfo:
            doc->infoMessages++;
            break;
        case TidyWarning:
            doc->warnings++;
            break;
        case TidyConfig:
            doc->optionErrors++;
            break;
        case TidyAccess:
            doc->accessErrors++;
            break;
        case TidyError:
            doc->errors++;
            break;
        case TidyBadDocument:
            doc->docErrors++;
            break;
        case TidyFatal:
            /* Ack! */
            break;
        default:
            break;
    }

    /* Suppress report messages if they've been muted. */
    go = go & !message->muted;

    /* Suppress report messages if we've already reached the reporting limit. */
    if ( message->level <= TidyFatal )
    {
        go = go & ( doc->errors < cfg(doc, TidyShowErrors) );
    }

    /* Let TidyQuiet silence a lot of things. */
    if ( cfgBool( doc, TidyQuiet ) == yes )
    {
        go = go && message->code != STRING_DOCTYPE_GIVEN;
        go = go && message->code != STRING_CONTENT_LOOKS;
        go = go && message->code != STRING_NO_SYSID;
        go = go && message->level != TidyDialogueInfo;
        go = go && message->level != TidyConfig;
        go = go && message->level != TidyInfo;
        go = go && !(message->level >= TidyDialogueSummary &&
                            message->code != STRING_NEEDS_INTERVENTION);
    }

    /* Let !TidyShowInfo silence some things. */
    if ( cfgBool( doc, TidyShowInfo ) == no )
    {
        go = go && message->level != TidyInfo;

        /* Temporary; TidyShowInfo shouldn't affect TidyDialogueInfo, but
           right now such messages are hidden until we granularize the
           output controls. */
        go = go && message->level != TidyDialogueInfo;
    }

    /* Let !TidyShowWarnings silence some things. */
    if ( cfgBool( doc, TidyShowWarnings ) == no )
    {
        go = go && message->level != TidyWarning;
    }

    /* Output the message if applicable. */
    if ( go )
    {
        TidyOutputSink *outp = &doc->errout->sink;
        ctmbstr cp;
        byte b = '\0';
        for ( cp = message->messageOutput; *cp; ++cp )
        {
            b = (*cp & 0xff);
            if (b == (byte)'\n')
                TY_(WriteChar)( b, doc->errout );   /* for EOL translation */
            else
                outp->putByte( outp->sinkData, b ); /* #383 - no encoding */
        }

        /* Always add a trailing newline. Reports require this, and dialogue
           messages will be better spaced out without having to fill the
           language file with superfluous newlines. */
        TY_(WriteChar)( '\n', doc->errout );
    }

    TY_(tidyMessageRelease)(message);
}